

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerSha1WithRsaEncryptionDataAfterSequence_Test::
~SignatureAlgorithmTest_ParseDerSha1WithRsaEncryptionDataAfterSequence_Test
          (SignatureAlgorithmTest_ParseDerSha1WithRsaEncryptionDataAfterSequence_Test *this)

{
  SignatureAlgorithmTest_ParseDerSha1WithRsaEncryptionDataAfterSequence_Test *this_local;
  
  ~SignatureAlgorithmTest_ParseDerSha1WithRsaEncryptionDataAfterSequence_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerSha1WithRsaEncryptionDataAfterSequence) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x05,
      0x05, 0x00,  // NULL (0 bytes)
      0x02, 0x01, 0x00,  // INTEGER (1 byte)
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}